

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

string_type * __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render(string_type *__return_storage_ptr__,
        basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        *this,context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *ctx)

{
  anon_class_8_1_3fcf671e local_1c0;
  render_handler local_1b8;
  wostringstream local_198 [8];
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *ctx_local;
  basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_198);
  local_1c0.ss = (basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                  *)local_198;
  std::function<void(std::__cxx11::wstring_const&)>::
  function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render(kainjow::mustache::context_internal<std::__cxx11::wstring>&)::_lambda(std::__cxx11::wstring_const&)_1_,void>
            ((function<void(std::__cxx11::wstring_const&)> *)&local_1b8,&local_1c0);
  render(this,&local_1b8,ctx,true);
  Catch::clara::std::
  function<void_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
  ::~function(&local_1b8);
  std::__cxx11::wostringstream::str();
  std::__cxx11::wostringstream::~wostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string_type render(context_internal<string_type>& ctx) {
        std::basic_ostringstream<typename string_type::value_type> ss;
        render([&ss](const string_type& str) {
            ss << str;
        }, ctx);
        return ss.str();
    }